

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int ly_set_rm_index(ly_set *set,uint index)

{
  uint uVar1;
  LY_ERR *pLVar2;
  lys_node **pplVar3;
  
  if ((set != (ly_set *)0x0) && (index + 1 <= set->number)) {
    uVar1 = set->number - 1;
    pplVar3 = (set->set).s;
    if (uVar1 == index) {
      pplVar3 = pplVar3 + index;
    }
    else {
      pplVar3[index] = pplVar3[uVar1];
      pplVar3 = (set->set).s + uVar1;
    }
    *pplVar3 = (lys_node *)0x0;
    set->number = uVar1;
    return 0;
  }
  pLVar2 = ly_errno_location();
  *pLVar2 = LY_EINVAL;
  return 1;
}

Assistant:

API int
ly_set_rm_index(struct ly_set *set, unsigned int index)
{
    if (!set || (index + 1) > set->number) {
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    }

    if (index == set->number - 1) {
        /* removing last item in set */
        set->set.g[index] = NULL;
    } else {
        /* removing item somewhere in a middle, so put there the last item */
        set->set.g[index] = set->set.g[set->number - 1];
        set->set.g[set->number - 1] = NULL;
    }
    set->number--;

    return EXIT_SUCCESS;
}